

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChContactContainerNSC.cpp
# Opt level: O3

void __thiscall
chrono::ChContactContainerNSC::ChContactContainerNSC
          (ChContactContainerNSC *this,ChContactContainerNSC *other)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [32];
  
  ChContactContainer::ChContactContainer
            (&this->super_ChContactContainer,&other->super_ChContactContainer);
  (this->super_ChContactContainer).super_ChPhysicsItem.super_ChObj._vptr_ChObj =
       (_func_int **)&PTR__ChContactContainerNSC_00b12460;
  (this->contactlist_6_6).
  super__List_base<chrono::ChContactNSC<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<6>_>_*,_std::allocator<chrono::ChContactNSC<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<6>_>_*>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&this->contactlist_6_6;
  (this->contactlist_6_6).
  super__List_base<chrono::ChContactNSC<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<6>_>_*,_std::allocator<chrono::ChContactNSC<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<6>_>_*>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&this->contactlist_6_6;
  (this->contactlist_6_6).
  super__List_base<chrono::ChContactNSC<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<6>_>_*,_std::allocator<chrono::ChContactNSC<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<6>_>_*>_>
  ._M_impl._M_node._M_size = 0;
  (this->contactlist_6_3).
  super__List_base<chrono::ChContactNSC<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<3>_>_*,_std::allocator<chrono::ChContactNSC<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<3>_>_*>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&this->contactlist_6_3;
  (this->contactlist_6_3).
  super__List_base<chrono::ChContactNSC<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<3>_>_*,_std::allocator<chrono::ChContactNSC<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<3>_>_*>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&this->contactlist_6_3;
  (this->contactlist_6_3).
  super__List_base<chrono::ChContactNSC<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<3>_>_*,_std::allocator<chrono::ChContactNSC<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<3>_>_*>_>
  ._M_impl._M_node._M_size = 0;
  (this->contactlist_3_3).
  super__List_base<chrono::ChContactNSC<chrono::ChContactable_1vars<3>,_chrono::ChContactable_1vars<3>_>_*,_std::allocator<chrono::ChContactNSC<chrono::ChContactable_1vars<3>,_chrono::ChContactable_1vars<3>_>_*>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&this->contactlist_3_3;
  (this->contactlist_3_3).
  super__List_base<chrono::ChContactNSC<chrono::ChContactable_1vars<3>,_chrono::ChContactable_1vars<3>_>_*,_std::allocator<chrono::ChContactNSC<chrono::ChContactable_1vars<3>,_chrono::ChContactable_1vars<3>_>_*>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&this->contactlist_3_3;
  (this->contactlist_3_3).
  super__List_base<chrono::ChContactNSC<chrono::ChContactable_1vars<3>,_chrono::ChContactable_1vars<3>_>_*,_std::allocator<chrono::ChContactNSC<chrono::ChContactable_1vars<3>,_chrono::ChContactable_1vars<3>_>_*>_>
  ._M_impl._M_node._M_size = 0;
  (this->contactlist_333_3).
  super__List_base<chrono::ChContactNSC<chrono::ChContactable_3vars<3,_3,_3>,_chrono::ChContactable_1vars<3>_>_*,_std::allocator<chrono::ChContactNSC<chrono::ChContactable_3vars<3,_3,_3>,_chrono::ChContactable_1vars<3>_>_*>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&this->contactlist_333_3;
  (this->contactlist_333_3).
  super__List_base<chrono::ChContactNSC<chrono::ChContactable_3vars<3,_3,_3>,_chrono::ChContactable_1vars<3>_>_*,_std::allocator<chrono::ChContactNSC<chrono::ChContactable_3vars<3,_3,_3>,_chrono::ChContactable_1vars<3>_>_*>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&this->contactlist_333_3;
  (this->contactlist_333_3).
  super__List_base<chrono::ChContactNSC<chrono::ChContactable_3vars<3,_3,_3>,_chrono::ChContactable_1vars<3>_>_*,_std::allocator<chrono::ChContactNSC<chrono::ChContactable_3vars<3,_3,_3>,_chrono::ChContactable_1vars<3>_>_*>_>
  ._M_impl._M_node._M_size = 0;
  (this->contactlist_333_6).
  super__List_base<chrono::ChContactNSC<chrono::ChContactable_3vars<3,_3,_3>,_chrono::ChContactable_1vars<6>_>_*,_std::allocator<chrono::ChContactNSC<chrono::ChContactable_3vars<3,_3,_3>,_chrono::ChContactable_1vars<6>_>_*>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&this->contactlist_333_6;
  (this->contactlist_333_6).
  super__List_base<chrono::ChContactNSC<chrono::ChContactable_3vars<3,_3,_3>,_chrono::ChContactable_1vars<6>_>_*,_std::allocator<chrono::ChContactNSC<chrono::ChContactable_3vars<3,_3,_3>,_chrono::ChContactable_1vars<6>_>_*>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&this->contactlist_333_6;
  (this->contactlist_333_6).
  super__List_base<chrono::ChContactNSC<chrono::ChContactable_3vars<3,_3,_3>,_chrono::ChContactable_1vars<6>_>_*,_std::allocator<chrono::ChContactNSC<chrono::ChContactable_3vars<3,_3,_3>,_chrono::ChContactable_1vars<6>_>_*>_>
  ._M_impl._M_node._M_size = 0;
  (this->contactlist_333_333).
  super__List_base<chrono::ChContactNSC<chrono::ChContactable_3vars<3,_3,_3>,_chrono::ChContactable_3vars<3,_3,_3>_>_*,_std::allocator<chrono::ChContactNSC<chrono::ChContactable_3vars<3,_3,_3>,_chrono::ChContactable_3vars<3,_3,_3>_>_*>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&this->contactlist_333_333;
  (this->contactlist_333_333).
  super__List_base<chrono::ChContactNSC<chrono::ChContactable_3vars<3,_3,_3>,_chrono::ChContactable_3vars<3,_3,_3>_>_*,_std::allocator<chrono::ChContactNSC<chrono::ChContactable_3vars<3,_3,_3>,_chrono::ChContactable_3vars<3,_3,_3>_>_*>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&this->contactlist_333_333;
  (this->contactlist_333_333).
  super__List_base<chrono::ChContactNSC<chrono::ChContactable_3vars<3,_3,_3>,_chrono::ChContactable_3vars<3,_3,_3>_>_*,_std::allocator<chrono::ChContactNSC<chrono::ChContactable_3vars<3,_3,_3>,_chrono::ChContactable_3vars<3,_3,_3>_>_*>_>
  ._M_impl._M_node._M_size = 0;
  (this->contactlist_666_3).
  super__List_base<chrono::ChContactNSC<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_1vars<3>_>_*,_std::allocator<chrono::ChContactNSC<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_1vars<3>_>_*>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&this->contactlist_666_3;
  (this->contactlist_666_3).
  super__List_base<chrono::ChContactNSC<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_1vars<3>_>_*,_std::allocator<chrono::ChContactNSC<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_1vars<3>_>_*>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&this->contactlist_666_3;
  (this->contactlist_666_3).
  super__List_base<chrono::ChContactNSC<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_1vars<3>_>_*,_std::allocator<chrono::ChContactNSC<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_1vars<3>_>_*>_>
  ._M_impl._M_node._M_size = 0;
  (this->contactlist_666_6).
  super__List_base<chrono::ChContactNSC<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_1vars<6>_>_*,_std::allocator<chrono::ChContactNSC<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_1vars<6>_>_*>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&this->contactlist_666_6;
  (this->contactlist_666_6).
  super__List_base<chrono::ChContactNSC<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_1vars<6>_>_*,_std::allocator<chrono::ChContactNSC<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_1vars<6>_>_*>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&this->contactlist_666_6;
  (this->contactlist_666_6).
  super__List_base<chrono::ChContactNSC<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_1vars<6>_>_*,_std::allocator<chrono::ChContactNSC<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_1vars<6>_>_*>_>
  ._M_impl._M_node._M_size = 0;
  (this->contactlist_666_333).
  super__List_base<chrono::ChContactNSC<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_3vars<3,_3,_3>_>_*,_std::allocator<chrono::ChContactNSC<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_3vars<3,_3,_3>_>_*>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&this->contactlist_666_333;
  (this->contactlist_666_333).
  super__List_base<chrono::ChContactNSC<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_3vars<3,_3,_3>_>_*,_std::allocator<chrono::ChContactNSC<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_3vars<3,_3,_3>_>_*>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&this->contactlist_666_333;
  (this->contactlist_666_333).
  super__List_base<chrono::ChContactNSC<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_3vars<3,_3,_3>_>_*,_std::allocator<chrono::ChContactNSC<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_3vars<3,_3,_3>_>_*>_>
  ._M_impl._M_node._M_size = 0;
  (this->contactlist_666_666).
  super__List_base<chrono::ChContactNSC<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_3vars<6,_6,_6>_>_*,_std::allocator<chrono::ChContactNSC<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_3vars<6,_6,_6>_>_*>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&this->contactlist_666_666;
  (this->contactlist_666_666).
  super__List_base<chrono::ChContactNSC<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_3vars<6,_6,_6>_>_*,_std::allocator<chrono::ChContactNSC<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_3vars<6,_6,_6>_>_*>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&this->contactlist_666_666;
  (this->contactlist_666_666).
  super__List_base<chrono::ChContactNSC<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_3vars<6,_6,_6>_>_*,_std::allocator<chrono::ChContactNSC<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_3vars<6,_6,_6>_>_*>_>
  ._M_impl._M_node._M_size = 0;
  (this->contactlist_6_6_rolling).
  super__List_base<chrono::ChContactNSCrolling<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<6>_>_*,_std::allocator<chrono::ChContactNSCrolling<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<6>_>_*>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&this->contactlist_6_6_rolling
  ;
  (this->contactlist_6_6_rolling).
  super__List_base<chrono::ChContactNSCrolling<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<6>_>_*,_std::allocator<chrono::ChContactNSCrolling<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<6>_>_*>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&this->contactlist_6_6_rolling
  ;
  (this->contactlist_6_6_rolling).
  super__List_base<chrono::ChContactNSCrolling<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<6>_>_*,_std::allocator<chrono::ChContactNSCrolling<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<6>_>_*>_>
  ._M_impl._M_node._M_size = 0;
  (this->lastcontact_6_6)._M_node = (_List_node_base *)0x0;
  (this->lastcontact_6_3)._M_node = (_List_node_base *)0x0;
  (this->lastcontact_3_3)._M_node = (_List_node_base *)0x0;
  (this->lastcontact_333_3)._M_node = (_List_node_base *)0x0;
  (this->lastcontact_333_6)._M_node = (_List_node_base *)0x0;
  (this->lastcontact_333_333)._M_node = (_List_node_base *)0x0;
  (this->lastcontact_666_3)._M_node = (_List_node_base *)0x0;
  (this->lastcontact_666_6)._M_node = (_List_node_base *)0x0;
  (this->lastcontact_333_3)._M_node = (_List_node_base *)0x0;
  (this->lastcontact_333_6)._M_node = (_List_node_base *)0x0;
  (this->lastcontact_333_333)._M_node = (_List_node_base *)0x0;
  (this->lastcontact_666_3)._M_node = (_List_node_base *)0x0;
  (this->lastcontact_666_6)._M_node = (_List_node_base *)0x0;
  (this->lastcontact_666_333)._M_node = (_List_node_base *)0x0;
  (this->lastcontact_666_666)._M_node = (_List_node_base *)0x0;
  (this->lastcontact_6_6_rolling)._M_node = (_List_node_base *)0x0;
  auVar1 = ZEXT416(0) << 0x40;
  (this->contact_forces)._M_h._M_buckets = &(this->contact_forces)._M_h._M_single_bucket;
  (this->contact_forces)._M_h._M_bucket_count = 1;
  (this->contact_forces)._M_h._M_before_begin = (__node_base)auVar1._0_8_;
  (this->contact_forces)._M_h._M_element_count = auVar1._8_8_;
  (this->contact_forces)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  *(undefined1 (*) [16])&(this->contact_forces)._M_h._M_rehash_policy._M_next_resize = auVar1;
  auVar2 = ZEXT432(0) << 0x40;
  this->n_added_333_3 = auVar2._0_4_;
  this->n_added_333_6 = auVar2._4_4_;
  this->n_added_333_333 = auVar2._8_4_;
  this->n_added_666_3 = auVar2._12_4_;
  this->n_added_666_6 = auVar2._16_4_;
  this->n_added_666_333 = auVar2._20_4_;
  this->n_added_666_666 = auVar2._24_4_;
  this->n_added_6_6_rolling = auVar2._28_4_;
  this->n_added_6_6 = auVar2._0_4_;
  this->n_added_6_3 = auVar2._4_4_;
  this->n_added_3_3 = auVar2._8_4_;
  this->n_added_333_3 = auVar2._12_4_;
  this->n_added_333_6 = auVar2._16_4_;
  this->n_added_333_333 = auVar2._20_4_;
  this->n_added_666_3 = auVar2._24_4_;
  this->n_added_666_6 = auVar2._28_4_;
  return;
}

Assistant:

ChContactContainerNSC::ChContactContainerNSC(const ChContactContainerNSC& other) : ChContactContainer(other) {
    n_added_6_6 = 0;
    n_added_6_3 = 0;
    n_added_3_3 = 0;
    n_added_333_3 = 0;
    n_added_333_6 = 0;
    n_added_333_333 = 0;
    n_added_666_3 = 0;
    n_added_666_6 = 0;
    n_added_666_333 = 0;
    n_added_666_666 = 0;
    n_added_6_6_rolling = 0;
}